

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

void __thiscall cppcms::widgets::base_widget::base_widget(base_widget *this)

{
  (this->super_base_form)._vptr_base_form = (_func_int **)&PTR_render_002898a0;
  (this->id_)._M_dataplus._M_p = (pointer)&(this->id_).field_2;
  (this->id_)._M_string_length = 0;
  (this->id_).field_2._M_local_buf[0] = '\0';
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->message_).n_ = 0;
  (this->message_).c_id_ = (char_type *)0x0;
  (this->message_).c_context_ = (char_type *)0x0;
  (this->message_).c_plural_ = (char_type *)0x0;
  (this->message_).id_._M_dataplus._M_p = (pointer)&(this->message_).id_.field_2;
  (this->message_).id_._M_string_length = 0;
  (this->message_).id_.field_2._M_local_buf[0] = '\0';
  (this->message_).context_._M_dataplus._M_p = (pointer)&(this->message_).context_.field_2;
  (this->message_).context_._M_string_length = 0;
  (this->message_).context_.field_2._M_local_buf[0] = '\0';
  (this->message_).plural_._M_dataplus._M_p = (pointer)&(this->message_).plural_.field_2;
  (this->message_).plural_._M_string_length = 0;
  (this->message_).plural_.field_2._M_local_buf[0] = '\0';
  (this->error_message_).n_ = 0;
  (this->error_message_).c_plural_ = (char_type *)0x0;
  (this->error_message_).c_id_ = (char_type *)0x0;
  (this->error_message_).c_context_ = (char_type *)0x0;
  (this->error_message_).id_._M_dataplus._M_p = (pointer)&(this->error_message_).id_.field_2;
  (this->error_message_).id_._M_string_length = 0;
  (this->error_message_).id_.field_2._M_local_buf[0] = '\0';
  (this->error_message_).context_._M_dataplus._M_p =
       (pointer)&(this->error_message_).context_.field_2;
  (this->error_message_).context_._M_string_length = 0;
  (this->error_message_).context_.field_2._M_local_buf[0] = '\0';
  (this->error_message_).plural_._M_dataplus._M_p = (pointer)&(this->error_message_).plural_.field_2
  ;
  (this->error_message_).plural_._M_string_length = 0;
  (this->error_message_).plural_.field_2._M_local_buf[0] = '\0';
  (this->help_).n_ = 0;
  (this->help_).c_id_ = (char_type *)0x0;
  (this->help_).c_context_ = (char_type *)0x0;
  (this->help_).c_plural_ = (char_type *)0x0;
  (this->help_).id_._M_dataplus._M_p = (pointer)&(this->help_).id_.field_2;
  (this->help_).id_._M_string_length = 0;
  (this->help_).id_.field_2._M_local_buf[0] = '\0';
  (this->help_).context_._M_dataplus._M_p = (pointer)&(this->help_).context_.field_2;
  (this->help_).context_._M_string_length = 0;
  (this->help_).context_.field_2._M_local_buf[0] = '\0';
  (this->help_).plural_._M_dataplus._M_p = (pointer)&(this->help_).plural_.field_2;
  (this->help_).plural_._M_string_length = 0;
  (this->help_).plural_.field_2._M_local_buf[0] = '\0';
  (this->attr_)._M_dataplus._M_p = (pointer)&(this->attr_).field_2;
  (this->attr_)._M_string_length = 0;
  (this->attr_).field_2._M_local_buf[0] = '\0';
  this->parent_ = (form *)0x0;
  this->field_0x1f0 = 1;
  (this->d).ptr_ = (_data *)0x0;
  return;
}

Assistant:

base_widget::base_widget() : 
	parent_(0),
	is_valid_(1),
	is_set_(0),
	is_disabled_(0),
	is_readonly_(0),
	is_generation_done_(0),
	has_message_(0),
	has_error_(0),
	has_help_(0)
{
}